

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverADMM.cpp
# Opt level: O3

void __thiscall chrono::ChSolverADMM::ChSolverADMM(ChSolverADMM *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ChSolverSparseQR *pCVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined1 local_29;
  ChSolverSparseQR *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  ChIterativeSolverVI::ChIterativeSolverVI(&this->super_ChIterativeSolverVI);
  (this->super_ChIterativeSolverVI).super_ChIterativeSolver._vptr_ChIterativeSolver =
       (_func_int **)&PTR__ChSolverADMM_00b3a640;
  (this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver._vptr_ChSolver =
       (_func_int **)&PTR__ChSolverADMM_00b3a6a8;
  this->r_prim = 0.0;
  this->r_dual = 0.0;
  this->precond = false;
  this->rho = 0.1;
  this->rho_b = 1e-09;
  this->sigma = 1e-06;
  this->stepadjust_each = 5;
  this->stepadjust_threshold = 1.5;
  this->stepadjust_maxfactor = 50.0;
  this->stepadjust_type = BALANCED_FAST;
  this->tol_prim = 1e-06;
  this->tol_dual = 1e-06;
  this->acceleration = BASIC;
  (this->LS_solver).super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->LS_solver).super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28 = (ChSolverSparseQR *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChSolverSparseQR,std::allocator<chrono::ChSolverSparseQR>>
            (a_Stack_20,&local_28,(allocator<chrono::ChSolverSparseQR> *)&local_29);
  _Var2._M_pi = a_Stack_20[0]._M_pi;
  pCVar1 = local_28;
  local_28 = (ChSolverSparseQR *)0x0;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->LS_solver).
            super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->LS_solver).super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = &pCVar1->super_ChDirectSolverLS;
  (this->LS_solver).super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
    }
  }
  return;
}

Assistant:

ChSolverADMM::ChSolverADMM() :
        r_prim(0),
        r_dual(0),
        precond(false),
        rho(0.1),
        rho_b(1e-9),
        sigma(1e-6),
        stepadjust_each(5),
        stepadjust_threshold(1.5),
        stepadjust_maxfactor(50),
        stepadjust_type(AdmmStepType::BALANCED_FAST),
        tol_prim(1e-6),
        tol_dual(1e-6),
        acceleration(AdmmAcceleration::BASIC)
{
    LS_solver = chrono_types::make_shared<ChSolverSparseQR>();
}